

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

ssize_t __thiscall TCPConnection::read(TCPConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  ostream *poVar1;
  ulong uVar2;
  undefined4 in_register_00000034;
  uchar *__result;
  ulong uVar3;
  uchar *puVar4;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_98;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_88;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_68;
  iterator local_48;
  
  __result = (uchar *)CONCAT44(in_register_00000034,__fd);
  local_98._M_device = &this->_read_m;
  local_98._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_98);
  local_98._M_owns = true;
  if ((this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    puVar4 = (uchar *)0x0;
    goto LAB_00104dfd;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"try to read",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"from server",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Available size is ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_88._M_node =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_68._M_node =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_88._M_cur =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_88._M_first =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_68._M_last =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_68._M_cur =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  puVar4 = local_68._M_last +
           (long)(local_88._M_cur +
                 ((((((ulong)((long)local_88._M_node - (long)local_68._M_node) >> 3) - 1) +
                   (ulong)(local_88._M_node == (_Map_pointer)0x0)) * 0x200 - (long)local_88._M_first
                  ) - (long)local_68._M_cur));
  if (puVar4 < __buf) {
    local_88._M_last =
         (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    std::__copy_move_dit<false,unsigned_char,unsigned_char&,unsigned_char*,unsigned_char*>
              (&local_68,&local_88,__result);
    hexDump((char *)0x0,__result,(int)puVar4);
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_recv_buf);
    if (this->state_ == ESTABLISHED) {
      this->_buffer_ready = false;
      *(byte *)&this->poll_flags_ = (byte)this->poll_flags_ & 0xfe;
    }
    goto LAB_00104dfd;
  }
  uVar3 = ((long)local_68._M_cur - (long)local_68._M_first) + (long)__buf;
  if ((long)uVar3 < 0) {
    uVar2 = (long)uVar3 >> 9;
LAB_00104d0e:
    local_88._M_node = local_68._M_node + uVar2;
    local_88._M_first = *local_88._M_node;
    local_88._M_last = local_88._M_first + 0x200;
    local_88._M_cur = local_88._M_first + uVar3 + uVar2 * -0x200;
  }
  else {
    if (0x1ff < uVar3) {
      uVar2 = uVar3 >> 9;
      goto LAB_00104d0e;
    }
    local_88._M_cur = local_68._M_cur + (long)__buf;
    local_88._M_node = local_68._M_node;
    local_88._M_first = local_68._M_first;
    local_88._M_last = local_68._M_last;
  }
  std::__copy_move_dit<false,unsigned_char,unsigned_char&,unsigned_char*,unsigned_char*>
            (&local_68,&local_88,__result);
  local_68._M_cur =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_68._M_node =
       (this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar3 = ((long)local_68._M_cur -
          (long)(this->_recv_buf).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Deque_impl_data._M_start._M_first) + (long)__buf;
  if ((long)uVar3 < 0) {
    uVar2 = (long)uVar3 >> 9;
LAB_00104d9b:
    local_88._M_node = local_68._M_node + uVar2;
    local_88._M_first = *local_88._M_node;
    local_88._M_cur = local_88._M_first + uVar3 + uVar2 * -0x200;
    local_68._M_first = *local_68._M_node;
  }
  else {
    if (0x1ff < uVar3) {
      uVar2 = uVar3 >> 9;
      goto LAB_00104d9b;
    }
    local_88._M_cur = local_68._M_cur + (long)__buf;
    local_88._M_first = *local_68._M_node;
    local_88._M_node = local_68._M_node;
    local_68._M_first = local_88._M_first;
  }
  local_68._M_last = local_68._M_first + 0x200;
  local_88._M_last = local_88._M_first + 0x200;
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_erase
            (&local_48,&this->_recv_buf,&local_68,&local_88);
  hexDump((char *)0x0,__result,(int)__buf);
  puVar4 = (uchar *)__buf;
LAB_00104dfd:
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  return (ssize_t)puVar4;
}

Assistant:

ssize_t TCPConnection::read(uint8_t *buf, size_t size) {
    std::unique_lock lck(_read_m);
//    std::cout << "before wait" << std::endl;
//    _cv.wait(lck, [&] { return _buffer_ready; });
//    std::cout << "after wait" << std::endl;
    if (_recv_buf.empty()) {
        return 0;
    }
    std::cout << "try to read" << size << "from server" << std::endl;
    std::cout << "Available size is " << _recv_buf.size() << std::endl;
    if (size > _recv_buf.size()) {
        size_t read_size = _recv_buf.size();
        std::copy(_recv_buf.begin(), _recv_buf.end(), buf);
        hexDump(nullptr, buf, read_size);
        _recv_buf.clear();
        if (state_ == State::ESTABLISHED) {
            _buffer_ready = false;
            poll_flags_ &= ~POLLIN;
        }
        return read_size;
    } else {
        std::copy(_recv_buf.begin(), _recv_buf.begin() + size, buf);
        _recv_buf.erase(_recv_buf.begin(), _recv_buf.begin() + size);
        hexDump(nullptr, buf, size);
        return size;
    }
}